

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormat::ComputeUnknownMessageSetItemsSize
                 (UnknownFieldSet *unknown_fields)

{
  pointer pUVar1;
  int iVar2;
  int iVar3;
  anon_union_8_5_912831f5_for_data_ *paVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  
  pUVar1 = (unknown_fields->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (uint)((ulong)((long)(unknown_fields->fields_).
                               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 4);
  if (0 < (int)uVar6) {
    uVar5 = (ulong)(uVar6 & 0x7fffffff);
    paVar4 = &pUVar1->data_;
    sVar8 = 0;
    do {
      if (*(uint32 *)((long)paVar4 + -4) == 3) {
        uVar6 = ((UnknownField *)(paVar4 + -1))->number_ | 1;
        iVar2 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
          }
        }
        uVar6 = (uint)*(pointer *)
                       ((long)&(paVar4->group_->fields_).
                               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                       + 8);
        uVar7 = uVar6 | 1;
        iVar3 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> iVar3 == 0; iVar3 = iVar3 + -1) {
          }
        }
        sVar8 = (long)(int)uVar6 + sVar8 + 4 + (ulong)(iVar2 * 9 + 0x49U >> 6) +
                (ulong)(iVar3 * 9 + 0x49U >> 6);
      }
      paVar4 = paVar4 + 2;
      uVar5 = uVar5 - 1;
    } while (uVar5 != 0);
    return sVar8;
  }
  return 0;
}

Assistant:

size_t WireFormat::ComputeUnknownMessageSetItemsSize(
    const UnknownFieldSet& unknown_fields) {
  size_t size = 0;
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      size += WireFormatLite::kMessageSetItemTagsSize;
      size += io::CodedOutputStream::VarintSize32(field.number());

      int field_size = field.GetLengthDelimitedSize();
      size += io::CodedOutputStream::VarintSize32(field_size);
      size += field_size;
    }
  }

  return size;
}